

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O1

int raw_find_str(memptr *raw_value,char *str)

{
  char cVar1;
  int iVar2;
  __int32_t **pp_Var3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char cVar7;
  
  pcVar5 = raw_value->buf;
  cVar1 = pcVar5[raw_value->length];
  cVar7 = *pcVar5;
  if (cVar7 != '\0') {
    lVar6 = 1;
    pp_Var3 = __ctype_tolower_loc();
    pcVar4 = pcVar5;
    do {
      *pcVar4 = (char)(*pp_Var3)[cVar7];
      pcVar5 = raw_value->buf;
      pcVar4 = pcVar5 + lVar6;
      cVar7 = pcVar5[lVar6];
      lVar6 = lVar6 + 1;
    } while (cVar7 != '\0');
  }
  pcVar5[raw_value->length] = '\0';
  pcVar5 = raw_value->buf;
  pcVar4 = strstr(pcVar5,str);
  pcVar5[raw_value->length] = cVar1;
  if (pcVar4 == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = (int)pcVar4 - *(int *)&raw_value->buf;
  }
  return iVar2;
}

Assistant:

int raw_find_str(memptr *raw_value, const char *str)
{
	char c;
	char *ptr;
	int i = 0;

	/* save */
	c = raw_value->buf[raw_value->length];

	/* Make it lowercase */
	for (i = 0; raw_value->buf[i]; ++i) {
		raw_value->buf[i] = (char)tolower(raw_value->buf[i]);
	}

	/* null-terminate */
	raw_value->buf[raw_value->length] = 0;

	/* Find the substring position */
	ptr = strstr(raw_value->buf, str);

	/* restore the "length" byte */
	raw_value->buf[raw_value->length] = c;

	if (ptr == 0) {
		return -1;
	}

	/* return index */
	return (int)(ptr - raw_value->buf);
}